

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextobject.cpp
# Opt level: O1

int __thiscall QTextFragment::length(QTextFragment *this)

{
  uint n;
  int iVar1;
  
  n = this->n;
  iVar1 = 0;
  if ((n != 0 && this->p != (QTextDocumentPrivate *)0x0) && (iVar1 = 0, n != this->ne)) {
    iVar1 = 0;
    do {
      iVar1 = iVar1 + (this->p->fragments).data.field_0.fragments[n].super_QFragment<1>.size_array
                      [0];
      n = QFragmentMapData<QTextFragmentData>::next(&(this->p->fragments).data,n);
    } while (n != this->ne);
  }
  return iVar1;
}

Assistant:

int QTextFragment::length() const
{
    if (!p || !n)
        return 0;

    int len = 0;
    int f = n;
    while (f != ne) {
        len += p->fragmentMap().size(f);
        f = p->fragmentMap().next(f);
    }
    return len;
}